

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IT8951.c
# Opt level: O0

void GetIT8951SystemInfo(void *pBuf)

{
  IT8951DevInfo *pstDevInfo;
  uint16_t *pusWord;
  void *pBuf_local;
  
  LCDWriteCmdCode(0x302);
  LCDReadNData((uint16_t *)pBuf,0x14);
  printf("Panel(W,H) = (%d,%d)\r\n",(ulong)*pBuf,(ulong)*(ushort *)((long)pBuf + 2));
  printf("Image Buffer Address = %X\r\n",(ulong)*(uint *)((long)pBuf + 4));
  printf("FW Version = %s\r\n",(long)pBuf + 8);
  printf("LUT Version = %s\r\n",(long)pBuf + 0x18);
  return;
}

Assistant:

void GetIT8951SystemInfo(void* pBuf)
{
	uint16_t* pusWord = (uint16_t*)pBuf;
	IT8951DevInfo* pstDevInfo;

	//Send I80 CMD
	LCDWriteCmdCode(USDEF_I80_CMD_GET_DEV_INFO);
 
	//Burst Read Request for SPI interface only
	LCDReadNData(pusWord, sizeof(IT8951DevInfo)/2);//Polling HRDY for each words(2-bytes) if possible
	
	//Show Device information of IT8951
	pstDevInfo = (IT8951DevInfo*)pBuf;
	printf("Panel(W,H) = (%d,%d)\r\n",
	pstDevInfo->usPanelW, pstDevInfo->usPanelH );
	printf("Image Buffer Address = %X\r\n",
	pstDevInfo->usImgBufAddrL | (pstDevInfo->usImgBufAddrH << 16));
	//Show Firmware and LUT Version
	printf("FW Version = %s\r\n", (uint8_t*)pstDevInfo->usFWVersion);
	printf("LUT Version = %s\r\n", (uint8_t*)pstDevInfo->usLUTVersion);
}